

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O3

ssize_t __thiscall directory::read(directory *this,int __fd,void *__buf,size_t __nbytes)

{
  pointer puVar1;
  pointer extraout_RAX;
  pointer extraout_RAX_00;
  pointer puVar2;
  undefined4 in_register_00000034;
  char *pcVar3;
  pointer puVar4;
  long lVar5;
  allocator_type local_39;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  pcVar3 = (char *)CONCAT44(in_register_00000034,__fd);
  std::istream::seekg(pcVar3,0,0);
  std::istream::read(pcVar3,(long)this);
  std::istream::read(pcVar3,(long)&this->bucket_size);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_38,(ulong)this->bucket_size,&local_39);
  puVar2 = local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  puVar4 = (this->bucket_ids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->bucket_ids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->bucket_ids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->bucket_ids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->bucket_ids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4,(long)puVar1 - (long)puVar4);
    puVar2 = extraout_RAX;
    if (local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      puVar2 = extraout_RAX_00;
    }
  }
  if (this->bucket_size != 0) {
    lVar5 = 0;
    puVar4 = (pointer)0x0;
    do {
      std::istream::read(pcVar3,(long)(this->bucket_ids).
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar5);
      puVar4 = (pointer)((long)puVar4 + 1);
      puVar2 = (pointer)(ulong)this->bucket_size;
      lVar5 = lVar5 + 4;
    } while (puVar4 < puVar2);
  }
  return (ssize_t)puVar2;
}

Assistant:

void directory::read(std::fstream &stream) {
    stream.seekg(0);

    stream.read((char *) &depth, DEPTHS);
    stream.read((char *) &bucket_size, BUCKET_SIZE);
    this->bucket_ids = vector<uint32_t>(bucket_size);

    for (int i = 0; i < bucket_size; ++i) {
        stream.read((char *) &bucket_ids[i], BUCKET_ID);
    }
}